

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O1

bool __thiscall cmCTestHG::LoadRevisions(cmCTestHG *this)

{
  pointer pcVar1;
  pointer pcVar2;
  long *plVar3;
  long *plVar4;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string hg;
  string range;
  string hgXMLTemplate;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  hg_log;
  OutputLogger err;
  LogParser out;
  long *local_2d0;
  long local_2c8;
  long local_2c0 [2];
  long *local_2b0;
  long local_2a8;
  long local_2a0;
  long lStack_298;
  long *local_290;
  long local_288;
  long local_280 [2];
  string local_270;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  OutputLogger local_238;
  undefined1 local_1f8 [32];
  undefined1 *local_1d8 [2];
  undefined1 local_1c8 [16];
  _func_int **local_1b8 [2];
  _func_int *local_1a8 [2];
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  undefined1 local_168 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_158;
  undefined1 local_148 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_138;
  long local_128 [31];
  
  pcVar1 = local_1f8 + 0x10;
  pcVar2 = (this->super_cmCTestGlobalVC).OldRevision._M_dataplus._M_p;
  local_1f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,pcVar2,
             pcVar2 + (this->super_cmCTestGlobalVC).OldRevision._M_string_length);
  std::__cxx11::string::append((char *)local_1f8);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             (local_1f8,
                              (ulong)(this->super_cmCTestGlobalVC).NewRevision._M_dataplus._M_p);
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    local_2a0 = *plVar4;
    lStack_298 = plVar3[3];
    local_2b0 = &local_2a0;
  }
  else {
    local_2a0 = *plVar4;
    local_2b0 = (long *)*plVar3;
  }
  local_2a8 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((pointer)local_1f8._0_8_ != pcVar1) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  local_2d0 = local_2c0;
  pcVar2 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2d0,pcVar2,
             pcVar2 + (this->super_cmCTestGlobalVC).super_cmCTestVC.CommandLineTool._M_string_length
            );
  local_290 = local_280;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,
             "<logentry\n   revision=\"{node|short}\">\n  <author>{author|person}</author>\n  <email>{author|email}</email>\n  <date>{date|isodate}</date>\n  <msg>{desc}</msg>\n  <files>{files}</files>\n  <file_adds>{file_adds}</file_adds>\n  <file_dels>{file_dels}</file_dels>\n</logentry>\n"
             ,"");
  local_1f8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,local_2d0,local_2c8 + (long)local_2d0);
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"log","");
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b8,"--removed","");
  local_198[0] = local_188;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"-r","");
  local_178._M_allocated_capacity = (size_type)local_168;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_178,local_2b0,local_2a8 + (long)local_2b0);
  local_158._M_allocated_capacity = (size_type)local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"--template","");
  plVar3 = local_128;
  local_138._M_allocated_capacity = (size_type)plVar3;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_138,local_290,local_288 + (long)local_290);
  __l._M_len = 7;
  __l._M_array = (iterator)local_1f8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_250,__l,(allocator_type *)&local_238);
  lVar5 = -0xe0;
  do {
    if (plVar3 != (long *)plVar3[-2]) {
      operator_delete((long *)plVar3[-2],*plVar3 + 1);
    }
    plVar3 = plVar3 + -4;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0);
  LogParser::LogParser((LogParser *)local_1f8,this,"log-out> ");
  (**(code **)(local_1f8._0_8_ + 0x10))(local_1f8,"<?xml version=\"1.0\"?>\n<log>\n",0x1c);
  cmProcessTools::OutputLogger::OutputLogger
            (&local_238,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"log-err> ");
  local_270._M_string_length = 0;
  local_270.field_2._M_local_buf[0] = '\0';
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  cmCTestVC::RunChild((cmCTestVC *)this,&local_250,(OutputParser *)local_1f8,
                      (OutputParser *)&local_238,&local_270,Auto);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,
                    CONCAT71(local_270.field_2._M_allocated_capacity._1_7_,
                             local_270.field_2._M_local_buf[0]) + 1);
  }
  (**(code **)(local_1f8._0_8_ + 0x10))(local_1f8,"</log>\n",7);
  local_238.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_00bdd8c8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238.super_LineParser.Line._M_dataplus._M_p !=
      &local_238.super_LineParser.Line.field_2) {
    operator_delete(local_238.super_LineParser.Line._M_dataplus._M_p,
                    local_238.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  LogParser::~LogParser((LogParser *)local_1f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_250);
  if (local_290 != local_280) {
    operator_delete(local_290,local_280[0] + 1);
  }
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0,local_2c0[0] + 1);
  }
  if (local_2b0 != &local_2a0) {
    operator_delete(local_2b0,local_2a0 + 1);
  }
  return true;
}

Assistant:

bool cmCTestHG::LoadRevisions()
{
  // Use 'hg log' to get revisions in a xml format.
  //
  // TODO: This should use plumbing or python code to be more precise.
  // The "list of strings" templates like {files} will not work when
  // the project has spaces in the path.  Also, they may not have
  // proper XML escapes.
  std::string range = this->OldRevision + ":" + this->NewRevision;
  std::string hg = this->CommandLineTool;
  std::string hgXMLTemplate = "<logentry\n"
                              "   revision=\"{node|short}\">\n"
                              "  <author>{author|person}</author>\n"
                              "  <email>{author|email}</email>\n"
                              "  <date>{date|isodate}</date>\n"
                              "  <msg>{desc}</msg>\n"
                              "  <files>{files}</files>\n"
                              "  <file_adds>{file_adds}</file_adds>\n"
                              "  <file_dels>{file_dels}</file_dels>\n"
                              "</logentry>\n";
  std::vector<std::string> hg_log = { hg,    "log",        "--removed",  "-r",
                                      range, "--template", hgXMLTemplate };

  LogParser out(this, "log-out> ");
  out.Process("<?xml version=\"1.0\"?>\n"
              "<log>\n");
  OutputLogger err(this->Log, "log-err> ");
  this->RunChild(hg_log, &out, &err);
  out.Process("</log>\n");
  return true;
}